

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  int iVar1;
  IResultCapture *pIVar2;
  SectionInfo *info_local;
  Section *this_local;
  
  NonCopyable::NonCopyable(&this->super_NonCopyable);
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00286f58;
  SectionInfo::SectionInfo(&this->m_info,info);
  std::__cxx11::string::string((string *)&this->m_name);
  Counts::Counts(&this->m_assertions);
  pIVar2 = getResultCapture();
  iVar1 = (*pIVar2->_vptr_IResultCapture[2])(pIVar2,&this->m_info,&this->m_assertions);
  this->m_sectionIncluded = (bool)((byte)iVar1 & 1);
  Timer::Timer(&this->m_timer);
  Timer::start(&this->m_timer);
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_sectionIncluded( getResultCapture().sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }